

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca_test.cpp
# Opt level: O2

void __thiscall LCA_LCA_Test::TestBody(LCA_LCA_Test *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int a;
  char *message;
  int b;
  AssertHelper local_60;
  internal local_58 [8];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  iVar2 = 0;
  do {
    if (iVar2 == 10) {
      return;
    }
    generateTree(0x32);
    initLCA(0,0x32);
    for (a = 0; a != 0x32; a = a + 1) {
      b = 0;
LAB_001216ac:
      iVar1 = a;
      iVar3 = b;
      if (b != 0x32) {
        do {
          while( true ) {
            if (iVar1 == iVar3) {
              gtest_ar.message_.ptr_._4_4_ = iVar1;
              local_38.ptr_._0_4_ = lca(a,b);
              testing::internal::CmpHelperEQ<int,int>
                        (local_58,"aa","lca(a, b)",(int *)((long)&gtest_ar.message_.ptr_ + 4),
                         (int *)&local_38);
              if (local_58[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_38);
                message = "";
                if (gtest_ar._0_8_ != 0) {
                  message = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_60,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/lca_test.cpp"
                           ,0x42,message);
                testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_38);
                testing::internal::AssertHelper::~AssertHelper(&local_60);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&local_38);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar);
              b = b + 1;
              goto LAB_001216ac;
            }
            if (d[iVar3] <= d[iVar1]) break;
            iVar3 = pred[iVar3][0];
          }
          iVar1 = pred[iVar1][0];
        } while( true );
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

TEST(LCA, LCA) {
    int n = 50;
    rep(tests, 0, 10) {
        generateTree(n);
        initLCA(0, n);
        rep(a, 0, n) rep(b, 0, n) {
            int aa = a, bb = b;
            while (aa != bb) {
                if (d[aa] >= d[bb]) {
                    aa = pred[aa][0];
                } else {
                    bb = pred[bb][0];
                }
            }
            EXPECT_EQ(aa, lca(a, b));
        }
    }
}